

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O2

bool __thiscall senjo::TestCommandHandle::Parse(TestCommandHandle *this,char *params)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Output *this_00;
  bool invalid;
  char *params_local;
  Output local_90 [4];
  string *local_70;
  TestCommandHandle *local_68;
  Output local_60;
  uint64_t *local_58;
  int *local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  params_local = params;
  if ((Parse(char_const*)::argCount_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argCount_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argCount_abi_cxx11_,"count",(allocator *)local_90);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argCount_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argCount_abi_cxx11_);
  }
  if ((Parse(char_const*)::argDepth_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argDepth_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argDepth_abi_cxx11_,"depth",(allocator *)local_90);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argDepth_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argDepth_abi_cxx11_);
  }
  if ((Parse(char_const*)::argFile_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argFile_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argFile_abi_cxx11_,"file",(allocator *)local_90);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argFile_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argFile_abi_cxx11_);
  }
  if ((Parse(char_const*)::argGain_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argGain_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argGain_abi_cxx11_,"gain",(allocator *)local_90);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argGain_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argGain_abi_cxx11_);
  }
  if ((Parse(char_const*)::argNoClear_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argNoClear_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argNoClear_abi_cxx11_,"noclear",(allocator *)local_90)
    ;
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argNoClear_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argNoClear_abi_cxx11_);
  }
  if ((Parse(char_const*)::argPrint_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argPrint_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argPrint_abi_cxx11_,"print",(allocator *)local_90);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argPrint_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argPrint_abi_cxx11_);
  }
  if ((Parse(char_const*)::argSkip_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argSkip_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argSkip_abi_cxx11_,"skip",(allocator *)local_90);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argSkip_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argSkip_abi_cxx11_);
  }
  if ((Parse(char_const*)::argTime_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(char_const*)::argTime_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)&Parse(char_const*)::argTime_abi_cxx11_,"time",(allocator *)local_90);
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argTime_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argTime_abi_cxx11_);
  }
  this->noClear = false;
  this->printBoard = false;
  local_38 = &this->maxCount;
  local_40 = &this->maxDepth;
  local_48 = &this->minGain;
  local_50 = &this->skipCount;
  this->maxTime = 0;
  local_58 = &this->maxTime;
  local_70 = &this->fileName;
  this->maxCount = 0;
  this->maxDepth = 0;
  this->minGain = 0;
  this->skipCount = 0;
  local_68 = this;
  std::__cxx11::string::assign((char *)local_70);
  invalid = false;
  do {
    if (((invalid & 1U) != 0) || (params_local == (char *)0x0)) {
      if ((invalid & 1U) == 0) {
LAB_0013c181:
        if ((local_68->fileName)._M_string_length != 0) {
          return true;
        }
        std::__cxx11::string::_M_assign((string *)local_70);
        return true;
      }
      Output::Output(&local_60,InfoPrefix);
      std::operator<<((ostream *)&std::cout,"usage: ");
      (*(local_68->super_BackgroundCommand)._vptr_BackgroundCommand[3])(local_90);
      std::operator<<((ostream *)&std::cout,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      this_00 = &local_60;
      goto LAB_0013c178;
    }
    pcVar3 = NextWord(&params_local);
    if (*pcVar3 == '\0') goto LAB_0013c181;
    bVar1 = HasParam(&Parse(char_const*)::argNoClear_abi_cxx11_,&this->noClear,&params_local);
  } while (((((bVar1) ||
             (bVar1 = HasParam(&Parse(char_const*)::argPrint_abi_cxx11_,&this->printBoard,
                               &params_local), bVar1)) ||
            (bVar1 = NumberParam<int>(&Parse(char_const*)::argCount_abi_cxx11_,local_38,
                                      &params_local,&invalid), bVar1)) ||
           ((bVar1 = NumberParam<int>(&Parse(char_const*)::argDepth_abi_cxx11_,local_40,
                                      &params_local,&invalid), bVar1 ||
            (bVar1 = NumberParam<int>(&Parse(char_const*)::argGain_abi_cxx11_,local_48,&params_local
                                      ,&invalid), bVar1)))) ||
          ((bVar1 = NumberParam<int>(&Parse(char_const*)::argSkip_abi_cxx11_,local_50,&params_local,
                                     &invalid), bVar1 ||
           ((bVar1 = NumberParam<unsigned_long>
                               (&Parse(char_const*)::argTime_abi_cxx11_,local_58,&params_local,
                                &invalid), bVar1 ||
            (bVar1 = StringParam(&Parse(char_const*)::argFile_abi_cxx11_,local_70,&params_local,
                                 &invalid), bVar1))))));
  Output::Output(local_90,InfoPrefix);
  std::operator<<((ostream *)&std::cout,"Unexpected token: ");
  std::operator<<((ostream *)&std::cout,params_local);
  this_00 = local_90;
LAB_0013c178:
  Output::~Output(this_00);
  return false;
}

Assistant:

bool TestCommandHandle::Parse(const char* params)
{
  static const std::string argCount   = "count";
  static const std::string argDepth   = "depth";
  static const std::string argFile    = "file";
  static const std::string argGain    = "gain";
  static const std::string argNoClear = "noclear";
  static const std::string argPrint   = "print";
  static const std::string argSkip    = "skip";
  static const std::string argTime    = "time";

  noClear    = false;
  printBoard = false;
  maxCount   = 0;
  maxDepth   = 0;
  minGain    = 0;
  skipCount  = 0;
  maxTime    = 0;
  fileName   = "";

  bool invalid = false;
  while (!invalid && params && *NextWord(params)) {
    if (HasParam(argNoClear,  noClear,    params) ||
        HasParam(argPrint,    printBoard, params) ||
        NumberParam(argCount, maxCount,   params, invalid) ||
        NumberParam(argDepth, maxDepth,   params, invalid) ||
        NumberParam(argGain,  minGain,    params, invalid) ||
        NumberParam(argSkip,  skipCount,  params, invalid) ||
        NumberParam(argTime,  maxTime,    params, invalid) ||
        StringParam(argFile,  fileName,   params, invalid))
    {
      continue;
    }
    Output() << "Unexpected token: " << params;
    return false;
  }
  if (invalid) {
    Output() << "usage: " << Usage();
    return false;
  }

  if (fileName.empty()) {
    fileName = _TEST_FILE;
  }

  return true;
}